

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall
Lowerer::LowerLdElemI(Lowerer *this,Instr *instr,JnHelperMethod helperMethod,bool isHelper)

{
  LowererMD *this_00;
  IRType IVar1;
  IRType IVar2;
  Instr *pIVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  ObjectType OVar7;
  BailOutKind BVar8;
  JnHelperMethod JVar9;
  undefined4 *puVar10;
  JitProfilingInstr *instr_00;
  LabelInstr *instr_01;
  Opnd *this_01;
  IndirOpnd *this_02;
  IndirOpnd *pIVar11;
  RegOpnd *opndArg;
  AddrOpnd *local_48;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType baseValueType;
  
  pIVar3 = instr->m_prev;
  if (instr->m_kind == InstrKindJitProfiling) {
    if (helperMethod != HelperOp_GetElementI) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x243f,"(helperMethod == IR::HelperOp_GetElementI)",
                         "helperMethod == IR::HelperOp_GetElementI");
      if (!bVar5) goto LAB_00550702;
      *puVar10 = 0;
    }
    if (isHelper) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2440,"(!isHelper)","!isHelper");
      if (!bVar5) goto LAB_00550702;
      *puVar10 = 0;
    }
    instr_00 = IR::Instr::AsJitProfilingInstr(instr);
    LowerProfiledLdElemI(this,instr_00);
    return pIVar3;
  }
  if ((!isHelper) && (bVar5 = IR::Instr::DoStackArgsOpt(instr), bVar5)) {
    instr_01 = IR::LabelInstr::New(Label,instr->m_func,false);
    GenerateFastArgumentsLdElemI(this,instr,(LabelInstr *)0x0);
    IR::Instr::InsertBefore(instr,&instr_01->super_Instr);
    IR::Instr::UnlinkSrc1(instr);
    IR::Instr::UnlinkDst(instr);
    if (((instr->field_0x38 & 0x10) == 0) ||
       (BVar8 = IR::Instr::GetBailOutKind(instr), BVar8 != BailOnStackArgsOutOfActualsRange)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x244d,
                         "(instr->HasBailOutInfo() && instr->GetBailOutKind() == IR::BailOutKind::BailOnStackArgsOutOfActualsRange)"
                         ,
                         "instr->HasBailOutInfo() && instr->GetBailOutKind() == IR::BailOutKind::BailOnStackArgsOutOfActualsRange"
                        );
      if (!bVar5) goto LAB_00550702;
      *puVar10 = 0;
    }
    GenerateBailOut(this,instr,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
    return pIVar3;
  }
  this_01 = IR::Instr::UnlinkSrc1(instr);
  bVar5 = IR::Opnd::IsIndirOpnd(this_01);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2453,"(src1->IsIndirOpnd())","Expected indirOpnd");
    if (!bVar5) goto LAB_00550702;
    *puVar10 = 0;
  }
  this_02 = IR::Opnd::AsIndirOpnd(this_01);
  IVar1 = instr->m_dst->m_type;
  local_48 = (AddrOpnd *)IR::IndirOpnd::UnlinkIndexOpnd(this_02);
  if (local_48 == (AddrOpnd *)0x0) {
    pIVar11 = IR::Opnd::AsIndirOpnd(this_01);
    local_48 = IR::AddrOpnd::NewFromNumber((long)pIVar11->m_offset,this->m_func,false);
LAB_00550466:
    bVar5 = true;
    if (IVar1 != TyVar) {
      helperMethod = IVar1 == TyInt32 ^ HelperOp_GetNativeFloatElementI;
      bVar5 = false;
    }
  }
  else {
    IVar2 = (local_48->super_Opnd).m_type;
    if ((IVar2 != TyInt32) && (IVar2 != TyUint32)) {
      if (IVar2 == TyVar) goto LAB_00550466;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x245b,
                         "(indexOpnd->GetType() == TyUint32 || indexOpnd->GetType() == TyInt32)",
                         "indexOpnd->GetType() == TyUint32 || indexOpnd->GetType() == TyInt32");
      if (!bVar5) goto LAB_00550702;
      *puVar10 = 0;
    }
    if (helperMethod == HelperOp_TypeofElem) {
      if (IVar1 != TyVar) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2479,"(dstType == TyVar)","dstType == TyVar");
        if (!bVar5) goto LAB_00550702;
        *puVar10 = 0;
      }
      helperMethod = ((local_48->super_Opnd).m_type != TyUint32) + HelperOp_TypeofElem_UInt32;
    }
    else {
      if (helperMethod != HelperOp_GetMethodElement) {
        if (helperMethod == HelperOp_GetElementI) {
          if ((local_48->super_Opnd).m_type == TyUint32) {
            JVar9 = IVar1 == TyInt32 ^ HelperOp_GetNativeFloatElementI_UInt32;
            helperMethod = HelperOp_GetElementI_UInt32;
          }
          else {
            JVar9 = IVar1 == TyInt32 ^ HelperOp_GetNativeFloatElementI_Int32;
            helperMethod = HelperOp_GetElementI_Int32;
          }
          if (IVar1 != TyVar) {
            helperMethod = JVar9;
          }
        }
        else {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x247f,"(false)","false");
          if (!bVar5) goto LAB_00550702;
          *puVar10 = 0;
        }
        bVar5 = true;
        goto LAB_005505e8;
      }
      if (IVar1 != TyVar) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2472,"(dstType == TyVar)","dstType == TyVar");
        if (!bVar5) {
LAB_00550702:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar10 = 0;
      }
      helperMethod = ((local_48->super_Opnd).m_type != TyUint32) + HelperOp_GetMethodElement_UInt32;
    }
    bVar5 = true;
  }
LAB_005505e8:
  bVar6 = Func::IsLoopBody(this->m_func);
  if (!bVar6) {
    local_32[0] = (this_02->m_baseOpnd->super_Opnd).m_valueType.field_0;
    bVar6 = ValueType::IsLikelyObject((ValueType *)&local_32[0].field_0);
    if (((bVar6) &&
        (OVar7 = ValueType::GetObjectType((ValueType *)&local_32[0].field_0), OVar7 == Array)) &&
       (bVar6 = ValueType::HasIntElements((ValueType *)&local_32[0].field_0), !bVar6)) {
      if (helperMethod == HelperOp_GetElementI_Int32) {
        bVar6 = ValueType::HasFloatElements((ValueType *)&local_32[0].field_0);
        helperMethod = bVar6 ^ HelperOp_GetElementI_Int32_ExpectingVarArray;
      }
      else if (helperMethod == HelperOp_GetElementI_UInt32) {
        bVar6 = ValueType::HasFloatElements((ValueType *)&local_32[0].field_0);
        helperMethod = HelperOp_GetElementI_UInt32_ExpectingVarArray - bVar6;
      }
      else if (helperMethod == HelperOp_GetElementI) {
        bVar6 = ValueType::HasFloatElements((ValueType *)&local_32[0].field_0);
        helperMethod = bVar6 ^ HelperOp_GetElementI_ExpectingVarArray;
      }
    }
  }
  if (bVar5) {
    LoadScriptContext(this,instr);
  }
  this_00 = &this->m_lowererMD;
  LowererMD::LoadHelperArgument(this_00,instr,&local_48->super_Opnd);
  opndArg = IR::IndirOpnd::UnlinkBaseOpnd(this_02);
  LowererMD::LoadHelperArgument(this_00,instr,&opndArg->super_Opnd);
  IR::Opnd::Free(this_01,this->m_func);
  LowererMD::ChangeToHelperCall
            (this_00,instr,helperMethod,(LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,
             isHelper);
  return pIVar3;
}

Assistant:

IR::Instr *
Lowerer::LowerLdElemI(IR::Instr * instr, IR::JnHelperMethod helperMethod, bool isHelper)
{
    IR::Instr *instrPrev = instr->m_prev;

    if(instr->IsJitProfilingInstr())
    {
        Assert(helperMethod == IR::HelperOp_GetElementI);
        Assert(!isHelper);
        LowerProfiledLdElemI(instr->AsJitProfilingInstr());
        return instrPrev;
    }

    if (!isHelper && instr->DoStackArgsOpt())
    {
        IR::LabelInstr * labelLdElem = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func);
        // Pass in null for labelFallThru to only generate the LdHeapArgument call
        GenerateFastArgumentsLdElemI(instr, nullptr);
        instr->InsertBefore(labelLdElem);
        instr->UnlinkSrc1();
        instr->UnlinkDst();
        Assert(instr->HasBailOutInfo() && instr->GetBailOutKind() == IR::BailOutKind::BailOnStackArgsOutOfActualsRange);
        instr = GenerateBailOut(instr, nullptr, nullptr);
        return instrPrev;
    }

    IR::Opnd *src1 = instr->UnlinkSrc1();
    AssertMsg(src1->IsIndirOpnd(), "Expected indirOpnd");
    IR::IndirOpnd *indirOpnd = src1->AsIndirOpnd();
    bool loadScriptContext = true;
    IRType dstType = instr->GetDst()->GetType();

    IR::Opnd *indexOpnd = indirOpnd->UnlinkIndexOpnd();
    if (indexOpnd && indexOpnd->GetType() != TyVar)
    {
        Assert(indexOpnd->GetType() == TyUint32 || indexOpnd->GetType() == TyInt32);
        switch (helperMethod)
        {
        case IR::HelperOp_GetElementI:

            if (indexOpnd->GetType() == TyUint32)
            {
                helperMethod =
                    dstType == TyVar ? IR::HelperOp_GetElementI_UInt32 :
                    dstType == TyInt32 ? IR::HelperOp_GetNativeIntElementI_UInt32 :
                    IR::HelperOp_GetNativeFloatElementI_UInt32;
            }
            else
            {
                helperMethod =
                    dstType == TyVar ? IR::HelperOp_GetElementI_Int32 :
                    dstType == TyInt32 ? IR::HelperOp_GetNativeIntElementI_Int32 :
                    IR::HelperOp_GetNativeFloatElementI_Int32;
            }
            break;

        case IR::HelperOp_GetMethodElement:

            Assert(dstType == TyVar);
            helperMethod = indexOpnd->GetType() == TyUint32?
                IR::HelperOp_GetMethodElement_UInt32 : IR::HelperOp_GetMethodElement_Int32;
            break;

        case IR::HelperOp_TypeofElem:

            Assert(dstType == TyVar);
            helperMethod = indexOpnd->GetType() == TyUint32?
                IR::HelperOp_TypeofElem_UInt32 : IR::HelperOp_TypeofElem_Int32;
            break;

        default:
            Assert(false);
        }
    }
    else
    {
        if (indexOpnd == nullptr)
        {
            // No index; the offset identifies the element.
            IntConstType offset = (IntConstType)src1->AsIndirOpnd()->GetOffset();
            indexOpnd = IR::AddrOpnd::NewFromNumber(offset, m_func);
        }

        if (dstType != TyVar)
        {
            loadScriptContext = false;
            helperMethod =
                dstType == TyInt32 ? IR::HelperOp_GetNativeIntElementI : IR::HelperOp_GetNativeFloatElementI;
        }
    }

    // Jitted loop bodies have volatile information about values created outside the loop, so don't update array creation site
    // profile data from jitted loop bodies
    if(!m_func->IsLoopBody())
    {
        const ValueType baseValueType(indirOpnd->GetBaseOpnd()->GetValueType());
        if( baseValueType.IsLikelyObject() &&
            baseValueType.GetObjectType() == ObjectType::Array &&
            !baseValueType.HasIntElements())
        {
            switch(helperMethod)
            {
                case IR::HelperOp_GetElementI:
                    helperMethod =
                        baseValueType.HasFloatElements()
                            ? IR::HelperOp_GetElementI_ExpectingNativeFloatArray
                            : IR::HelperOp_GetElementI_ExpectingVarArray;
                    break;

                case IR::HelperOp_GetElementI_UInt32:
                    helperMethod =
                        baseValueType.HasFloatElements()
                            ? IR::HelperOp_GetElementI_UInt32_ExpectingNativeFloatArray
                            : IR::HelperOp_GetElementI_UInt32_ExpectingVarArray;
                    break;

                case IR::HelperOp_GetElementI_Int32:
                    helperMethod =
                        baseValueType.HasFloatElements()
                            ? IR::HelperOp_GetElementI_Int32_ExpectingNativeFloatArray
                            : IR::HelperOp_GetElementI_Int32_ExpectingVarArray;
                    break;
            }
        }
    }

    if (loadScriptContext)
    {
        LoadScriptContext(instr);
    }

    m_lowererMD.LoadHelperArgument(instr, indexOpnd);

    IR::Opnd *baseOpnd = indirOpnd->UnlinkBaseOpnd();
    m_lowererMD.LoadHelperArgument(instr, baseOpnd);

    src1->Free(this->m_func);

    m_lowererMD.ChangeToHelperCall(instr, helperMethod, nullptr, nullptr, nullptr, isHelper);

    return instrPrev;
}